

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseFieldWithExtensionInfo<google::protobuf::UnknownFieldSet>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadata *metadata,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint32_t size;
  string *s;
  void *pvVar3;
  char *pcVar4;
  MessageLite *pMVar5;
  ulong value;
  UnknownFieldSet *this_00;
  uint64_t value_00;
  FieldType FVar6;
  undefined7 in_register_00000011;
  FieldDescriptor *pFVar7;
  uint64_t val;
  char *local_38;
  
  iVar2 = extension->type - 1;
  local_38 = ptr;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(iVar2) {
    case 0:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x01',extension->is_packed,extension->descriptor);
      pcVar4 = PackedDoubleParser(pvVar3,ptr,ctx);
      return pcVar4;
    case 1:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x02',extension->is_packed,extension->descriptor);
      pcVar4 = PackedFloatParser(pvVar3,ptr,ctx);
      return pcVar4;
    case 2:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x03',extension->is_packed,extension->descriptor);
      pcVar4 = PackedInt64Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 3:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x04',extension->is_packed,extension->descriptor);
      pcVar4 = PackedUInt64Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 4:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x05',extension->is_packed,extension->descriptor);
      pcVar4 = PackedInt32Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 5:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x06',extension->is_packed,extension->descriptor);
      pcVar4 = PackedFixed64Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 6:
      pvVar3 = MutableRawRepeatedField(this,number,'\a',extension->is_packed,extension->descriptor);
      pcVar4 = PackedFixed32Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 7:
      pvVar3 = MutableRawRepeatedField(this,number,'\b',extension->is_packed,extension->descriptor);
      pcVar4 = PackedBoolParser(pvVar3,ptr,ctx);
      return pcVar4;
    case 8:
    case 9:
    case 10:
    case 0xb:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&val,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x37);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&val,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val);
    case 0xc:
      pvVar3 = MutableRawRepeatedField(this,number,'\r',extension->is_packed,extension->descriptor);
      pcVar4 = PackedUInt32Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 0xd:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x0e',extension->is_packed,extension->descriptor);
      pcVar4 = PackedEnumParserArg<google::protobuf::UnknownFieldSet,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>
                         (pvVar3,ptr,ctx,(extension->field_6).enum_validity_check,metadata,number);
      return pcVar4;
    case 0xe:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x0f',extension->is_packed,extension->descriptor);
      pcVar4 = PackedSFixed32Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 0xf:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x10',extension->is_packed,extension->descriptor);
      pcVar4 = PackedSFixed64Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 0x10:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x11',extension->is_packed,extension->descriptor);
      pcVar4 = PackedSInt32Parser(pvVar3,ptr,ctx);
      return pcVar4;
    case 0x11:
      pvVar3 = MutableRawRepeatedField
                         (this,number,'\x12',extension->is_packed,extension->descriptor);
      pcVar4 = PackedSInt64Parser(pvVar3,ptr,ctx);
      return pcVar4;
    default:
      return ptr;
    }
  }
  switch(iVar2) {
  case 0:
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,*(double *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetDouble(this,number,'\x01',*(double *)ptr,extension->descriptor);
    return ptr + 8;
  case 1:
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,*(float *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetFloat(this,number,'\x02',*(float *)ptr,extension->descriptor);
    return ptr + 4;
  case 2:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 == (char *)0x0) break;
    if (extension->is_repeated != true) {
      value = CONCAT44(val._4_4_,(uint32_t)val);
      pFVar7 = extension->descriptor;
      FVar6 = '\x03';
      goto LAB_001b4718;
    }
    bVar1 = extension->is_packed;
    value = CONCAT44(val._4_4_,(uint32_t)val);
    pFVar7 = extension->descriptor;
    FVar6 = '\x03';
    goto LAB_001b44bc;
  case 3:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 != (char *)0x0) {
      if (extension->is_repeated != true) {
        value_00 = CONCAT44(val._4_4_,(uint32_t)val);
        pFVar7 = extension->descriptor;
        FVar6 = '\x04';
        goto LAB_001b46df;
      }
      bVar1 = extension->is_packed;
      value_00 = CONCAT44(val._4_4_,(uint32_t)val);
      pFVar7 = extension->descriptor;
      FVar6 = '\x04';
      goto LAB_001b454c;
    }
    break;
  case 4:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 != (char *)0x0) {
      if (extension->is_repeated != true) {
        pFVar7 = extension->descriptor;
        FVar6 = '\x05';
        goto LAB_001b46af;
      }
      bVar1 = extension->is_packed;
      pFVar7 = extension->descriptor;
      FVar6 = '\x05';
      goto LAB_001b42d9;
    }
    break;
  case 5:
    value_00 = *(uint64_t *)ptr;
    pcVar4 = ptr + 8;
    if (extension->is_repeated != true) {
      pFVar7 = extension->descriptor;
      FVar6 = '\x06';
LAB_001b46df:
      SetUInt64(this,number,FVar6,value_00,pFVar7);
      return pcVar4;
    }
    bVar1 = extension->is_packed;
    pFVar7 = extension->descriptor;
    FVar6 = '\x06';
LAB_001b454c:
    AddUInt64(this,number,FVar6,bVar1,value_00,pFVar7);
    return pcVar4;
  case 6:
    val._0_4_ = *(uint32_t *)ptr;
    pcVar4 = ptr + 4;
    if (extension->is_repeated != true) {
      pFVar7 = extension->descriptor;
      FVar6 = '\a';
LAB_001b4694:
      SetUInt32(this,number,FVar6,(uint32_t)val,pFVar7);
      return pcVar4;
    }
    bVar1 = extension->is_packed;
    pFVar7 = extension->descriptor;
    FVar6 = '\a';
LAB_001b45a2:
    AddUInt32(this,number,FVar6,bVar1,(uint32_t)val,pFVar7);
    return pcVar4;
  case 7:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddBool(this,number,'\b',extension->is_packed,CONCAT44(val._4_4_,(uint32_t)val) != 0,
                extension->descriptor);
        return pcVar4;
      }
      SetBool(this,number,'\b',CONCAT44(val._4_4_,(uint32_t)val) != 0,extension->descriptor);
      return pcVar4;
    }
    break;
  case 8:
  case 0xb:
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    size = ReadSize(&local_38);
    if (local_38 != (char *)0x0) {
      pcVar4 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,local_38,size,s);
      return pcVar4;
    }
    break;
  case 9:
    pMVar5 = (extension->field_6).message_info.prototype;
    if (extension->is_repeated == true) {
      pMVar5 = AddMessage(this,number,'\n',pMVar5,extension->descriptor);
    }
    else {
      pMVar5 = MutableMessage(this,number,'\n',pMVar5,extension->descriptor);
    }
    pcVar4 = ParseContext::ParseGroup(ctx,pMVar5,ptr,number * 8 + 3);
    return pcVar4;
  case 10:
    pMVar5 = (extension->field_6).message_info.prototype;
    if (extension->is_repeated == true) {
      pMVar5 = AddMessage(this,number,'\v',pMVar5,extension->descriptor);
    }
    else {
      pMVar5 = MutableMessage(this,number,'\v',pMVar5,extension->descriptor);
    }
    pcVar4 = ParseContext::ParseMessage(ctx,pMVar5,ptr);
    return pcVar4;
  case 0xc:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 != (char *)0x0) {
      if (extension->is_repeated != true) {
        pFVar7 = extension->descriptor;
        FVar6 = '\r';
        goto LAB_001b4694;
      }
      bVar1 = extension->is_packed;
      pFVar7 = extension->descriptor;
      FVar6 = '\r';
      goto LAB_001b45a2;
    }
    break;
  case 0xd:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 != (char *)0x0) {
      bVar1 = ExtensionInfo::EnumValidityCheck::IsValid
                        (&(extension->field_6).enum_validity_check,(uint32_t)val);
      if (!bVar1) {
        this_00 = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                            (metadata);
        UnknownFieldSet::AddVarint(this_00,number,(long)(int)(uint32_t)val);
        return pcVar4;
      }
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,(uint32_t)val,extension->descriptor);
        return pcVar4;
      }
      SetEnum(this,number,'\x0e',(uint32_t)val,extension->descriptor);
      return pcVar4;
    }
    break;
  case 0xe:
    val._0_4_ = *(uint32_t *)ptr;
    pcVar4 = ptr + 4;
    if (extension->is_repeated != true) {
      pFVar7 = extension->descriptor;
      FVar6 = '\x0f';
LAB_001b46af:
      SetInt32(this,number,FVar6,(uint32_t)val,pFVar7);
      return pcVar4;
    }
    bVar1 = extension->is_packed;
    pFVar7 = extension->descriptor;
    FVar6 = '\x0f';
LAB_001b42d9:
    AddInt32(this,number,FVar6,bVar1,(uint32_t)val,pFVar7);
    return pcVar4;
  case 0xf:
    value = *(ulong *)ptr;
    pcVar4 = ptr + 8;
    if (extension->is_repeated != true) {
      pFVar7 = extension->descriptor;
      FVar6 = '\x10';
LAB_001b4718:
      SetInt64(this,number,FVar6,value,pFVar7);
      return pcVar4;
    }
    bVar1 = extension->is_packed;
    pFVar7 = extension->descriptor;
    FVar6 = '\x10';
    goto LAB_001b44bc;
  case 0x10:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 != (char *)0x0) {
      val._0_4_ = -((uint32_t)val & 1) ^ (uint32_t)val >> 1;
      if (extension->is_repeated != true) {
        pFVar7 = extension->descriptor;
        FVar6 = '\x11';
        goto LAB_001b46af;
      }
      bVar1 = extension->is_packed;
      pFVar7 = extension->descriptor;
      FVar6 = '\x11';
      goto LAB_001b42d9;
    }
    break;
  case 0x11:
    pcVar4 = VarintParse<unsigned_long>(ptr,&val);
    if (pcVar4 == (char *)0x0) break;
    value = -(ulong)((uint32_t)val & 1) ^ CONCAT44(val._4_4_,(uint32_t)val) >> 1;
    if (extension->is_repeated != true) {
      pFVar7 = extension->descriptor;
      FVar6 = '\x12';
      goto LAB_001b4718;
    }
    bVar1 = extension->is_packed;
    pFVar7 = extension->descriptor;
    FVar6 = '\x12';
LAB_001b44bc:
    ptr = pcVar4;
    AddInt64(this,number,FVar6,bVar1,value,pFVar7);
  default:
    goto switchD_001b3ec0_default;
  }
  ptr = (char *)0x0;
switchD_001b3ec0_default:
  return ptr;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    InternalMetadata* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg<T>(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t value;                                                         \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
      HANDLE_VARINT_TYPE(BOOL, Bool);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t val;                                                           \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64_t tmp;
        ptr = VarintParse(ptr, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = tmp;

        if (!extension.enum_validity_check.IsValid(value)) {
          WriteVarint(number, value, metadata->mutable_unknown_fields<T>());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32_t tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}